

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O1

vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> * __thiscall
cfd::core::DescriptorScriptReference::GenerateAddresses
          (vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *__return_storage_ptr__,
          DescriptorScriptReference *this,NetType net_type)

{
  pointer pDVar1;
  pointer pDVar2;
  NetType local_1ac;
  void *local_1a8 [2];
  _Alloc_hider local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  pointer local_178;
  pointer local_160;
  pointer local_148;
  TapBranch local_130;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_b8;
  Script local_a0;
  AddressFormatData local_60;
  
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1ac = net_type;
  if (this->script_type_ - kDescriptorScriptMulti < 2) {
    pDVar2 = (this->keys_).
             super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pDVar1 = (this->keys_).
             super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pDVar2 != pDVar1) {
      do {
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pDVar2->pubkey_);
        ::std::vector<cfd::core::Address,std::allocator<cfd::core::Address>>::
        emplace_back<cfd::core::NetType&,cfd::core::Pubkey,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
                  ((vector<cfd::core::Address,std::allocator<cfd::core::Address>> *)
                   __return_storage_ptr__,&local_1ac,(Pubkey *)local_1a8,&this->addr_prefixes_);
        if (local_1a8[0] != (void *)0x0) {
          operator_delete(local_1a8[0]);
        }
        pDVar2 = pDVar2 + 1;
      } while (pDVar2 != pDVar1);
    }
  }
  else {
    GenerateAddress((Address *)local_1a8,this,net_type);
    ::std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::
    emplace_back<cfd::core::Address>(__return_storage_ptr__,(Address *)local_1a8);
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&((Address *)local_1a8)->format_data_);
    Script::~Script(&((Address *)local_1a8)->redeem_script_);
    local_130._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0025af68;
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
               ((long)&((Address *)local_1a8)->script_tree_ + 0x78));
    TapBranch::~TapBranch(&(((Address *)local_1a8)->script_tree_).super_TapBranch);
    if (local_148 != (pointer)0x0) {
      operator_delete(local_148);
    }
    if (local_160 != (pointer)0x0) {
      operator_delete(local_160);
    }
    if (local_178 != (pointer)0x0) {
      operator_delete(local_178);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)&((Address *)local_1a8)->address_ + 0x10U)) {
      operator_delete(local_198._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Address> DescriptorScriptReference::GenerateAddresses(
    NetType net_type) const {
  std::vector<Address> result;
  if ((script_type_ == DescriptorScriptType::kDescriptorScriptMulti) ||
      (script_type_ == DescriptorScriptType::kDescriptorScriptSortedMulti)) {
    for (const auto& key : keys_) {
      result.emplace_back(net_type, key.GetPubkey(), addr_prefixes_);
    }
  } else {
    result.push_back(GenerateAddress(net_type));
  }
  return result;
}